

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

word Mio_DeriveTruthTable6(Mio_Gate_t *pGate)

{
  word local_18;
  anon_union_8_2_94730283 uTruthRes;
  Mio_Gate_t *pGate_local;
  
  uTruthRes = (anon_union_8_2_94730283)pGate;
  if (pGate->nInputs < 7) {
    Mio_DeriveTruthTable(pGate,Mio_DeriveTruthTable6::uTruths6,pGate->nInputs,6,(uint *)&local_18);
    return local_18;
  }
  __assert_fail("pGate->nInputs <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                ,0x3b6,"word Mio_DeriveTruthTable6(Mio_Gate_t *)");
}

Assistant:

word Mio_DeriveTruthTable6( Mio_Gate_t * pGate )
{
    static unsigned uTruths6[6][2] = {
        { 0xAAAAAAAA, 0xAAAAAAAA },
        { 0xCCCCCCCC, 0xCCCCCCCC },
        { 0xF0F0F0F0, 0xF0F0F0F0 },
        { 0xFF00FF00, 0xFF00FF00 },
        { 0xFFFF0000, 0xFFFF0000 },
        { 0x00000000, 0xFFFFFFFF }
    };
    union {
      unsigned u[2];
      word w;
    } uTruthRes;
    assert( pGate->nInputs <= 6 );
    Mio_DeriveTruthTable( pGate, uTruths6, pGate->nInputs, 6, uTruthRes.u );
    return uTruthRes.w;
}